

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMipsInstruction.cpp
# Opt level: O2

void __thiscall CMipsInstruction::encodeNormal(CMipsInstruction *this)

{
  int iVar1;
  uint uVar2;
  MipsImmediateType MVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t data;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  uVar6 = (this->registerData).grs.num;
  uVar9 = (uVar6 & 0x1f) << 0x15;
  if (uVar6 == 0xffffffff) {
    uVar9 = 0;
  }
  uVar6 = (this->registerData).grt.num;
  uVar7 = (uVar6 & 0x1f) << 0x10;
  if (uVar6 == 0xffffffff) {
    uVar7 = 0;
  }
  uVar6 = (this->registerData).grd.num;
  uVar15 = (uVar6 & 0x1f) << 0xb;
  if (uVar6 == 0xffffffff) {
    uVar15 = 0;
  }
  uVar6 = (this->registerData).frt.num;
  uVar11 = (uVar6 & 0x1f) << 0x10;
  if (uVar6 == 0xffffffff) {
    uVar11 = 0;
  }
  uVar6 = (this->registerData).frs.num;
  uVar16 = (uVar6 & 0x1f) << 0xb;
  if (uVar6 == 0xffffffff) {
    uVar16 = 0;
  }
  uVar6 = (this->registerData).frd.num;
  uVar8 = (uVar6 & 0x1f) << 6;
  if (uVar6 == 0xffffffff) {
    uVar8 = 0;
  }
  iVar1 = (this->registerData).ps2vrt.num;
  uVar6 = iVar1 << 0x10;
  if (iVar1 == -1) {
    uVar6 = 0;
  }
  iVar1 = (this->registerData).ps2vrs.num;
  uVar17 = iVar1 << 0x15;
  if (iVar1 == -1) {
    uVar17 = 0;
  }
  iVar1 = (this->registerData).ps2vrd.num;
  uVar12 = iVar1 << 6;
  if (iVar1 == -1) {
    uVar12 = 0;
  }
  uVar2 = (this->registerData).rspvrt.num;
  uVar18 = (uVar2 & 0x1f) << 0x10;
  if (uVar2 == 0xffffffff) {
    uVar18 = 0;
  }
  uVar2 = (this->registerData).rspvrs.num;
  uVar13 = (uVar2 & 0x1f) << 0xb;
  if (uVar2 == 0xffffffff) {
    uVar13 = 0;
  }
  uVar2 = (this->registerData).rspvrd.num;
  uVar10 = (uVar2 & 0x1f) << 6;
  if (uVar2 == 0xffffffff) {
    uVar10 = 0;
  }
  uVar2 = (this->registerData).rspve.num;
  uVar5 = (uVar2 & 0xf) << 0x15;
  if (uVar2 == 0xffffffff) {
    uVar5 = 0;
  }
  uVar2 = (this->registerData).rspvde.num;
  uVar14 = (uVar2 & 0xf) << 0xb;
  if (uVar2 == 0xffffffff) {
    uVar14 = 0;
  }
  uVar2 = (this->registerData).rspvealt.num;
  uVar4 = (uVar2 & 0xf) << 7;
  if (uVar2 == 0xffffffff) {
    uVar4 = 0;
  }
  uVar2 = (this->opcodeData).opcode.flags;
  data = uVar4 | uVar14 |
         uVar5 | uVar10 | uVar13 | uVar18 | uVar12 | uVar17 | uVar6 |
         uVar8 | uVar16 | uVar11 | uVar15 | uVar7 | uVar9 | (this->opcodeData).opcode.destencoding;
  if (((uVar2 >> 0x11 & 1) == 0) && (iVar1 = (this->registerData).vrt.num, iVar1 != -1)) {
    data = data | iVar1 << 0x10;
  }
  MVar3 = (this->immediateData).primary.type;
  if (MVar3 < CacheOp) {
    if ((1000U >> (MVar3 & 0x1f) & 1) == 0) {
      if ((0x16U >> (MVar3 & 0x1f) & 1) != 0) {
        data = data | (this->immediateData).primary.value << 6;
      }
    }
    else {
      data = data | (this->immediateData).primary.value;
    }
  }
  MVar3 = (this->immediateData).secondary.type;
  if (MVar3 - Ext < 2) {
    uVar6 = (this->immediateData).secondary.value << 0xb;
  }
  else if (MVar3 == Cop2BranchType) {
    uVar6 = (this->immediateData).secondary.value << 0x12;
  }
  else {
    if (MVar3 != CacheOp) goto LAB_0016ec5d;
    uVar6 = (this->immediateData).secondary.value << 0x10;
  }
  data = data | uVar6;
LAB_0016ec5d:
  if ((uVar2 >> 0x11 & 1) != 0) {
    uVar6 = (this->registerData).vrt.num;
    data = data | (uVar6 & 0x1f) << 0x10 | (int)uVar6 >> 5;
  }
  FileManager::writeU32(g_fileManager,data);
  return;
}

Assistant:

void CMipsInstruction::encodeNormal() const
{
	int32_t encoding = opcodeData.opcode.destencoding;

	if (registerData.grs.num != -1) encoding |= MIPS_RS(registerData.grs.num);	// source reg
	if (registerData.grt.num != -1) encoding |= MIPS_RT(registerData.grt.num);	// target reg
	if (registerData.grd.num != -1) encoding |= MIPS_RD(registerData.grd.num);	// dest reg
	
	if (registerData.frt.num != -1) encoding |= MIPS_FT(registerData.frt.num);	// float target reg
	if (registerData.frs.num != -1) encoding |= MIPS_FS(registerData.frs.num);	// float source reg
	if (registerData.frd.num != -1) encoding |= MIPS_FD(registerData.frd.num);	// float dest reg

	if (registerData.ps2vrt.num != -1) encoding |= (registerData.ps2vrt.num << 16);	// ps2 vector target reg
	if (registerData.ps2vrs.num != -1) encoding |= (registerData.ps2vrs.num << 21);	// ps2 vector source reg
	if (registerData.ps2vrd.num != -1) encoding |= (registerData.ps2vrd.num << 6);	// ps2 vector dest reg

	if (registerData.rspvrt.num != -1) encoding |= MIPS_FT(registerData.rspvrt.num);	// rsp vector target reg
	if (registerData.rspvrs.num != -1) encoding |= MIPS_FS(registerData.rspvrs.num);	// rsp vector source reg
	if (registerData.rspvrd.num != -1) encoding |= MIPS_FD(registerData.rspvrd.num);	// rsp vector dest reg

	if (registerData.rspve.num != -1) encoding |= MIPS_RSP_VE(registerData.rspve.num);			// rsp element
	if (registerData.rspvde.num != -1) encoding |= MIPS_RSP_VDE(registerData.rspvde.num);		// rsp destination element
	if (registerData.rspvealt.num != -1) encoding |= MIPS_RSP_VEALT(registerData.rspvealt.num);	// rsp element (alt. placement)

	if (!(opcodeData.opcode.flags & MO_VFPU_MIXED) && registerData.vrt.num != -1)			// vfpu rt
		encoding |= registerData.vrt.num << 16;

	switch (immediateData.primary.type)
	{
	case MipsImmediateType::Immediate5:
	case MipsImmediateType::Immediate10:
	case MipsImmediateType::Immediate20:
		encoding |= immediateData.primary.value << 6;
		break;
	case MipsImmediateType::Immediate16:
	case MipsImmediateType::Immediate25:
	case MipsImmediateType::Immediate26:
	case MipsImmediateType::Immediate20_0:
	case MipsImmediateType::Immediate7:
	case MipsImmediateType::ImmediateHalfFloat:
		encoding |= immediateData.primary.value;
		break;
	default:
		// TODO: Assert?
		break;
	}

	switch (immediateData.secondary.type)
	{
	case MipsImmediateType::CacheOp:
		encoding |= immediateData.secondary.value << 16;
		break;
	case MipsImmediateType::Ext:
	case MipsImmediateType::Ins:
		encoding |= immediateData.secondary.value << 11;
		break;
	case MipsImmediateType::Cop2BranchType:
		encoding |= immediateData.secondary.value << 18;
		break;
	default:
		// TODO: Assert?
		break;
	}

	if (opcodeData.opcode.flags & MO_VFPU_MIXED)
	{
		// always vrt
		encoding |= registerData.vrt.num >> 5;
		encoding |= (registerData.vrt.num & 0x1F) << 16;
	}

	g_fileManager->writeU32((uint32_t)encoding);
}